

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O3

BreakpointProbe * __thiscall
Js::DebugDocument::SetBreakPoint_TTDWbpId
          (DebugDocument *this,int64 bpId,StatementLocation statement)

{
  ScriptContext *this_00;
  ArenaAllocator *alloc;
  BreakpointProbe *this_01;
  
  this_00 = (this->utf8SourceInfo->m_scriptContext).ptr;
  alloc = ScriptContext::AllocatorForDiagnostics(this_00);
  this_01 = (BreakpointProbe *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
  BreakpointProbe::BreakpointProbe(this_01,this,&statement,(int)bpId);
  ScriptContext::GetDebugContext(this_00);
}

Assistant:

BreakpointProbe* DebugDocument::SetBreakPoint_TTDWbpId(int64 bpId, StatementLocation statement)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();
        BreakpointProbe* pProbe = Anew(scriptContext->AllocatorForDiagnostics(), BreakpointProbe, this, statement, (uint32)bpId);

        scriptContext->GetDebugContext()->GetProbeContainer()->AddProbe(pProbe);
        BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
        pBreakpointList->Add(pProbe);
        return pProbe;
    }